

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_compiler.hpp
# Opt level: O0

string_type * __thiscall
boost::xpressive::
regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::parse_literal<char_const*>
          (regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
           *this,char **begin,char *end)

{
  char cVar1;
  long lVar2;
  long in_RCX;
  long *in_RDX;
  char **in_RSI;
  compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *in_RDI;
  escape_value eVar3;
  quant_spec spec;
  char *tmp;
  char *prev;
  escape_value esc;
  string_type *literal;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  compiler_token_type in_stack_fffffffffffffedc;
  regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *this_00;
  undefined8 local_d0;
  undefined8 local_b8;
  undefined8 local_80;
  char *local_60;
  long local_58;
  allocator local_3a;
  undefined1 local_39;
  escape_value local_38;
  long local_20;
  long *local_18;
  
  local_38.ch_ = '\0';
  local_38._1_3_ = 0;
  local_38.mark_nbr_ = 0;
  local_38.class_ = 0;
  local_38._10_2_ = 0;
  local_38.type_ = escape_char;
  local_39 = 0;
  cVar1 = *(char *)*in_RDX;
  this_00 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this_00,1,cVar1,&local_3a);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a);
  eVar3.class_ = (short)in_stack_fffffffffffffec8;
  eVar3._10_2_ = (short)((ulong)in_stack_fffffffffffffec8 >> 0x10);
  eVar3.type_ = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  eVar3.ch_ = (char)in_stack_fffffffffffffed0;
  eVar3._1_3_ = (int3)((ulong)in_stack_fffffffffffffed0 >> 8);
  eVar3.mark_nbr_ = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  local_58 = *local_18;
  local_60 = (char *)(*local_18 + 1);
  *local_18 = (long)local_60;
  do {
    if (*local_18 == local_20) {
      return (string_type *)in_RDI;
    }
    in_stack_fffffffffffffef7 =
         compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
         ::get_quant_spec<char_const*>
                   (this_00,in_RSI,(char *)in_RDI,
                    (quant_spec *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    if ((bool)in_stack_fffffffffffffef7) {
      lVar2 = std::__cxx11::string::size();
      if (lVar2 == 1) {
        return (string_type *)in_RDI;
      }
      *local_18 = local_58;
      std::__cxx11::string::end();
      prior<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(in_stack_fffffffffffffeb8);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                (in_stack_fffffffffffffec0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffeb8._M_current);
      std::__cxx11::string::erase(this_00,local_80);
      return (string_type *)in_RDI;
    }
    in_stack_fffffffffffffedc =
         compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
         ::get_token<char_const*>
                   ((compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),eVar3._0_8_,
                    eVar3._8_8_);
    if (in_stack_fffffffffffffedc == token_literal) {
      std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                (in_stack_fffffffffffffec0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffeb8._M_current);
      in_stack_fffffffffffffeb8._M_current =
           (char *)std::__cxx11::string::insert(this_00,local_d0,(int)*local_60);
      local_60 = local_60 + 1;
    }
    else {
      if (in_stack_fffffffffffffedc != token_escape) {
        return (string_type *)in_RDI;
      }
      eVar3 = parse_escape<char_const*>
                        (in_stack_fffffffffffffee0,(char **)CONCAT44(2,in_stack_fffffffffffffed8),
                         eVar3._0_8_);
      local_38.type_ = eVar3.type_;
      if (local_38.type_ != escape_char) {
        return (string_type *)in_RDI;
      }
      local_38 = eVar3;
      std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                (in_stack_fffffffffffffec0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffeb8._M_current);
      in_stack_fffffffffffffec0 =
           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::__cxx11::string::insert(this_00,local_b8,(int)local_38.ch_);
    }
    local_58 = *local_18;
    *local_18 = (long)local_60;
  } while( true );
}

Assistant:

string_type parse_literal(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        BOOST_ASSERT(begin != end);
        BOOST_ASSERT(token_literal == this->traits_.get_token(begin, end));
        escape_value esc = { 0, 0, 0, detail::escape_char };
        string_type literal(1, *begin);

        for(FwdIter prev = begin, tmp = ++begin; begin != end; prev = begin, begin = tmp)
        {
            detail::quant_spec spec = { 0, 0, false, &this->hidden_mark_count_ };
            if(this->traits_.get_quant_spec(tmp, end, spec))
            {
                if(literal.size() != 1)
                {
                    begin = prev;
                    literal.erase(boost::prior(literal.end()));
                }
                return literal;
            }
            else switch(this->traits_.get_token(tmp, end))
            {
            case token_escape:
                esc = this->parse_escape(tmp, end);
                if(detail::escape_char != esc.type_) return literal;
                literal.insert(literal.end(), esc.ch_);
                break;
            case token_literal:
                literal.insert(literal.end(), *tmp++);
                break;
            default:
                return literal;
            }
        }

        return literal;
    }